

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_source_over(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (const_alpha != 0xff) {
    color = BYTE_MUL(color,const_alpha);
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = BYTE_MUL(dest[uVar3],~color >> 0x18);
    dest[uVar3] = uVar1 + color;
  }
  return;
}

Assistant:

static void composition_solid_source_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    uint32_t ialpha = 255 - plutovg_alpha(color);
    for(int i = 0; i < length; i++) {
        dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}